

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O1

void __thiscall xemmai::t_directory::t_directory(t_directory *this,wstring_view a_path)

{
  undefined8 *puVar1;
  string_type local_68;
  path local_48;
  
  puVar1 = (undefined8 *)__tls_get_addr(&PTR_0011ece0);
  (this->super_t_owned).v_owner = (t_queue<128UL> *)*puVar1;
  xemmai::portable::f_convert_abi_cxx11_(&local_68,a_path._M_len,a_path._M_str);
  std::filesystem::__cxx11::path::path(&local_48,&local_68,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&this->v_i,&local_48,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

t_directory(std::wstring_view a_path) : v_i(portable::f_convert(a_path))
	{
	}